

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O3

bool __thiscall
SmallDenseSet<TypePair,_TypePairHasher,_4U>::contains
          (SmallDenseSet<TypePair,_TypePairHasher,_4U> *this,TypePair *key)

{
  uint uVar1;
  TypePair *pTVar2;
  TypeBase *pTVar3;
  byte bVar4;
  ulong uVar5;
  uint uVar6;
  TypeBase *pTVar7;
  bool bVar8;
  
  uVar1 = this->bucketCount;
  if (uVar1 == 0) {
    bVar8 = false;
  }
  else {
    pTVar2 = this->data;
    uVar5 = (ulong)(key->b->nameHash + key->a->nameHash & uVar1 - 1);
    pTVar7 = pTVar2[uVar5].a;
    pTVar3 = pTVar2[uVar5].b;
    if (pTVar7 == (TypeBase *)0x0 && pTVar3 == (TypeBase *)0x0) {
      bVar8 = false;
    }
    else {
      bVar4 = 1;
      uVar6 = 1;
      bVar8 = true;
      do {
        if (((pTVar7 == key->a) && (pTVar3 == key->b)) || (bVar8 = uVar6 < uVar1, uVar6 == uVar1))
        goto LAB_0017817f;
        uVar5 = (ulong)((int)uVar5 + uVar6 & uVar1 - 1);
        pTVar7 = pTVar2[uVar5].a;
        pTVar3 = pTVar2[uVar5].b;
        uVar6 = uVar6 + 1;
      } while (pTVar3 != (TypeBase *)0x0 || pTVar7 != (TypeBase *)0x0);
      bVar4 = 0;
LAB_0017817f:
      bVar8 = (bool)(bVar8 & bVar4);
    }
  }
  return bVar8;
}

Assistant:

bool contains(const Key& key)
	{
		unsigned bucketMask = bucketCount - 1;
		unsigned bucket = Hasher()(key) & bucketMask;

		for(unsigned i = 0; i < bucketCount; i++)
		{
			Key &item = data[bucket];

			if(item == Key())
				return false;

			if(item == key)
				return true;

			// Quadratic probing
			bucket = (bucket + i + 1) & bucketMask;
		}

		return false;
	}